

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_rawfile_open(char *filename,int rwmode,int *hdl)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int *piVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long __off;
  size_t sVar12;
  ulong uVar13;
  double *dvalues;
  long lVar14;
  size_t sVar15;
  byte *pbVar16;
  byte *pbVar17;
  size_t msize;
  FILE *diskfile;
  char *cptr2;
  fitsfile *fptr;
  char rootfile [1025];
  uint local_4cc;
  byte local_4bc;
  int local_4b8;
  int local_4b4;
  undefined4 local_4b0;
  undefined4 local_4ac;
  byte *local_4a8;
  FILE *local_4a0;
  size_t local_498;
  byte *local_490;
  size_t local_488;
  undefined4 local_47c;
  long local_478;
  long local_470;
  long local_468;
  long local_460;
  long local_458;
  int *local_448;
  fitsfile *local_440;
  char local_438 [1032];
  
  local_478 = 1;
  local_470 = 1;
  local_468 = 1;
  local_460 = 1;
  local_458 = 1;
  local_488 = 0;
  local_490 = (byte *)0x0;
  if (rwmode != 0) {
    ffpmsg("cannot open raw binary file with WRITE access (mem_rawfile_open)");
    ffpmsg(filename);
    return 0x70;
  }
  pcVar7 = strchr(filename,0x5b);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "binary file name missing \'[\' character (mem_rawfile_open)";
    goto LAB_0011ab6c;
  }
  local_438[0] = '\0';
  strncat(local_438,filename,(long)pcVar7 - (long)filename);
  local_4a8 = (byte *)(pcVar7 + 1);
  do {
    pbVar17 = local_4a8;
    bVar1 = *pbVar17;
    local_4a8 = pbVar17 + 1;
  } while (bVar1 == 0x20);
  if (0x61 < bVar1) {
    uVar13 = (ulong)(bVar1 - 0x62);
    switch(uVar13) {
    case 0:
      goto switchD_0011ab63_caseD_0;
    case 1:
    case 3:
    case 5:
    case 6:
      break;
    case 2:
      goto switchD_0011ab63_caseD_2;
    case 4:
      goto switchD_0011ab63_caseD_4;
    case 7:
      goto switchD_0011ab63_caseD_7;
    case 8:
      goto switchD_0011ab63_caseD_8;
    default:
      if (bVar1 == 0x75) {
LAB_0011ac68:
        lVar14 = 2;
        local_4b8 = 0x14;
        local_47c = (undefined4)CONCAT71((int7)(uVar13 >> 8),1);
        goto LAB_0011ac78;
      }
      if (bVar1 == 0x72) goto switchD_0011ab63_caseD_4;
    }
    goto switchD_0011ab63_caseD_1;
  }
  uVar13 = (ulong)(bVar1 - 0x42);
  switch(uVar13) {
  case 0:
switchD_0011ab63_caseD_0:
    lVar14 = 1;
    local_4b8 = 8;
    local_47c = 0;
LAB_0011ac78:
    local_4bc = 0;
    break;
  case 2:
switchD_0011ab63_caseD_2:
    lVar14 = 8;
    local_4b8 = -0x40;
    bVar4 = true;
    local_47c = 0;
    local_4bc = 0;
    bVar1 = 0;
    bVar3 = 0;
    goto LAB_0011ac98;
  case 4:
switchD_0011ab63_caseD_4:
    lVar14 = 4;
    local_4b8 = -0x20;
    bVar3 = 1;
    local_47c = 0;
    local_4bc = 0;
    bVar1 = 0;
    goto LAB_0011ac90;
  case 7:
switchD_0011ab63_caseD_7:
    lVar14 = 2;
    local_4b8 = 0x10;
    local_4bc = 1;
    local_47c = 0;
    break;
  case 8:
switchD_0011ab63_caseD_8:
    lVar14 = 4;
    local_4b8 = 0x20;
    bVar1 = 1;
    local_47c = 0;
    local_4bc = 0;
    goto LAB_0011ac88;
  default:
    if (bVar1 == 0x52) goto switchD_0011ab63_caseD_4;
    if (bVar1 == 0x55) goto LAB_0011ac68;
  case 1:
  case 3:
  case 5:
  case 6:
switchD_0011ab63_caseD_1:
    pcVar7 = "error in raw binary file datatype (mem_rawfile_open)";
LAB_0011ab6c:
    ffpmsg(pcVar7);
    ffpmsg(filename);
    return 0x7d;
  }
  bVar1 = 0;
LAB_0011ac88:
  bVar3 = 0;
LAB_0011ac90:
  bVar4 = false;
LAB_0011ac98:
  bVar2 = *local_4a8;
  if (bVar2 < 0x62) {
    if (bVar2 != 0x42) {
      if (bVar2 == 0x4c) {
LAB_0011acc8:
        local_4a8 = pbVar17 + 2;
      }
      goto LAB_0011acd0;
    }
LAB_0011ace0:
    local_4a8 = pbVar17 + 2;
    local_4ac = 1;
    local_4b0 = 0;
  }
  else {
    if (bVar2 == 0x62) goto LAB_0011ace0;
    if (bVar2 == 0x6c) goto LAB_0011acc8;
LAB_0011acd0:
    local_4b0 = 1;
    local_4ac = 0;
  }
  pbVar17 = local_4a8;
  local_448 = hdl;
  lVar8 = strtol((char *)local_4a8,(char **)&local_490,10);
  pbVar16 = local_490;
  lVar9 = 1;
  local_498 = lVar14;
  local_478 = lVar8;
  if (local_490 == (byte *)0x0) {
    pbVar16 = (byte *)0x0;
  }
  else if (*local_490 == 0x2c) {
    lVar14 = strtol((char *)(local_490 + 1),(char **)&local_4a8,10);
    pbVar17 = local_4a8;
    local_470 = lVar14;
    if (local_4a8 == (byte *)0x0) {
      local_4a8 = (byte *)0x0;
LAB_0011ae1e:
      local_4cc = 2;
      lVar10 = 1;
      pbVar17 = local_4a8;
    }
    else {
      if (*local_4a8 != 0x2c) goto LAB_0011ae1e;
      lVar10 = strtol((char *)(local_4a8 + 1),(char **)&local_490,10);
      local_468 = lVar10;
      if (local_490 != (byte *)0x0) {
        lVar9 = 1;
        if (*local_490 == 0x2c) {
          lVar11 = strtol((char *)(local_490 + 1),(char **)&local_4a8,10);
          pbVar17 = local_4a8;
          if (local_4a8 == (byte *)0x0) {
            local_4cc = 4;
          }
          else {
            local_4cc = *local_4a8 == 0x2c | 4;
          }
          local_460 = lVar11;
          lVar9 = strtol((char *)(local_4a8 + 1),(char **)&local_490,10);
          pbVar16 = local_490;
          local_458 = lVar9;
        }
        else {
          local_4cc = 3;
          lVar11 = 1;
          pbVar16 = local_490;
        }
        goto LAB_0011ae2e;
      }
      local_4cc = 3;
      pbVar16 = (byte *)0x0;
    }
    lVar11 = 1;
    lVar9 = 1;
    goto LAB_0011ae2e;
  }
  local_4cc = 1;
  lVar11 = 1;
  lVar10 = 1;
  lVar14 = 1;
LAB_0011ae2e:
  local_4a8 = pbVar16;
  if (pbVar16 < pbVar17) {
    local_4a8 = pbVar17;
  }
  if (*local_4a8 == 0x3a) {
    __off = strtol((char *)(local_4a8 + 1),(char **)0x0,10);
  }
  else {
    __off = 0;
  }
  lVar14 = lVar10 * lVar11 * lVar9 * lVar14 * lVar8;
  sVar15 = local_498 * lVar14;
  msize = ((sVar15 + 0xb3f) / 0xb40) * 0xb40 + 0xb40;
  local_488 = msize;
  iVar6 = file_openfile(local_438,0,(FILE **)&local_4a0);
  piVar5 = local_448;
  if (iVar6 == 0) {
    iVar6 = mem_createmem(msize,local_448);
    local_4b4 = iVar6;
    if (iVar6 == 0) {
      local_498 = sVar15;
      ffimem(&local_440,memTable[*piVar5].memaddrptr,&local_488,0,
             (_func_void_ptr_void_ptr_size_t *)0x0,&local_4b4);
      ffcrim(local_440,local_4b8,local_4cc,&local_478,&local_4b4);
      ffclos(local_440,&local_4b4);
      if (local_4b4 < 1) {
        if (0 < __off) {
          fseek(local_4a0,__off,0);
        }
        sVar15 = local_498;
        pcVar7 = *memTable[*piVar5].memaddrptr;
        dvalues = (double *)(pcVar7 + 0xb40);
        sVar12 = fread(dvalues,1,local_498,local_4a0);
        if (sVar12 != sVar15) {
          local_4b4 = 0x6c;
        }
        fclose(local_4a0);
        if (local_4b4 == 0) {
          if ((byte)local_47c != 0) {
            if ((char)local_4b0 == '\0') {
              if (0 < lVar14) {
                lVar8 = 0;
                do {
                  pbVar17 = (byte *)((long)dvalues + lVar8 * 2);
                  *pbVar17 = *pbVar17 ^ 0x80;
                  lVar8 = lVar8 + 1;
                } while (lVar14 - lVar8 != 0);
              }
            }
            else if (0 < lVar14) {
              lVar8 = 0;
              do {
                pbVar17 = (byte *)(pcVar7 + lVar8 * 2 + 0xb41);
                *pbVar17 = *pbVar17 ^ 0x80;
                lVar8 = lVar8 + 1;
              } while (lVar14 - lVar8 != 0);
            }
          }
          if ((char)local_4ac == '\0') {
            if ((byte)((byte)local_47c | local_4bc) == 1) {
              ffswap2((short *)dvalues,lVar14);
            }
            else if ((bool)(bVar1 | bVar3)) {
              ffswap4((int *)dvalues,lVar14);
            }
            else if (bVar4) {
              ffswap8(dvalues,lVar14);
            }
          }
          iVar6 = *piVar5;
          memTable[iVar6].currentpos = 0;
          memTable[iVar6].fitsfilesize = local_488;
          local_4b4 = 0;
        }
        else {
          iVar6 = *piVar5;
          free(*memTable[iVar6].memaddrptr);
          memTable[iVar6].memaddrptr = (char **)0x0;
          memTable[iVar6].memaddr = (char *)0x0;
          ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        }
      }
      else {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(local_4a0);
        iVar6 = *piVar5;
        free(*memTable[iVar6].memaddrptr);
        memTable[iVar6].memaddrptr = (char **)0x0;
        memTable[iVar6].memaddr = (char *)0x0;
      }
    }
    else {
      ffpmsg("failed to create memory file (mem_rawfile_open)");
      fclose(local_4a0);
      local_4b4 = iVar6;
    }
  }
  else {
    ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
    ffpmsg(local_438);
    local_4b4 = iVar6;
  }
  return local_4b4;
}

Assistant:

int mem_rawfile_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, writes a minimal
  image header, then copies the image data from the raw file into
  memory.  It will byteswap the pixel values if the raw array
  is in little endian byte order.
*/
{
    FILE *diskfile;
    fitsfile *fptr;
    short *sptr;
    int status, endian, datatype, bytePerPix, naxis;
    long dim[5] = {1,1,1,1,1}, ii, nvals, offset = 0;
    size_t filesize = 0, datasize;
    char rootfile[FLEN_FILENAME], *cptr = 0, *cptr2 = 0;
    void *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open raw binary file with WRITE access (mem_rawfile_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    cptr = strchr(filename, '[');   /* search for opening bracket [ */

    if (!cptr)
    {
        ffpmsg("binary file name missing '[' character (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    *rootfile = '\0';
    strncat(rootfile, filename, cptr - filename);  /* store the rootname */

    cptr++;

    while (*cptr == ' ')
       cptr++;    /* skip leading blanks */

    /* Get the Data Type of the Image */

    if (*cptr == 'b' || *cptr == 'B')
    {
      datatype = BYTE_IMG;
      bytePerPix = 1;
    }
    else if (*cptr == 'i' || *cptr == 'I')
    {
      datatype = SHORT_IMG;
      bytePerPix = 2;
    }
    else if (*cptr == 'u' || *cptr == 'U')
    {
      datatype = USHORT_IMG;
      bytePerPix = 2;

    }
    else if (*cptr == 'j' || *cptr == 'J')
    {
      datatype = LONG_IMG;
      bytePerPix = 4;
    }  
    else if (*cptr == 'r' || *cptr == 'R' || *cptr == 'f' || *cptr == 'F')
    {
      datatype = FLOAT_IMG;
      bytePerPix = 4;
    }    
    else if (*cptr == 'd' || *cptr == 'D')
    {
      datatype = DOUBLE_IMG;
      bytePerPix = 8;
    }
    else
    {
        ffpmsg("error in raw binary file datatype (mem_rawfile_open)");
        ffpmsg(filename);
        return(URL_PARSE_ERROR);
    }

    cptr++;

    /* get Endian: Big or Little; default is same as the local machine */
    
    if (*cptr == 'b' || *cptr == 'B')
    {
        endian = 0;
        cptr++;
    }
    else if (*cptr == 'l' || *cptr == 'L')
    {
        endian = 1;
        cptr++;
    }
    else
        endian = BYTESWAPPED; /* byteswapped machines are little endian */

    /* read each dimension (up to 5) */

    naxis = 1;
    dim[0] = strtol(cptr, &cptr2, 10);
    
    if (cptr2 && *cptr2 == ',')
    {
      naxis = 2;
      dim[1] = strtol(cptr2+1, &cptr, 10);

      if (cptr && *cptr == ',')
      {
        naxis = 3;
        dim[2] = strtol(cptr+1, &cptr2, 10);

        if (cptr2 && *cptr2 == ',')
        {
          naxis = 4;
          dim[3] = strtol(cptr2+1, &cptr, 10);

          if (cptr && *cptr == ',')
            naxis = 5;
            dim[4] = strtol(cptr+1, &cptr2, 10);
        }
      }
    }

    cptr = maxvalue(cptr, cptr2);

    if (*cptr == ':')   /* read starting offset value */
        offset = strtol(cptr+1, 0, 10);

    nvals = dim[0] * dim[1] * dim[2] * dim[3] * dim[4];
    datasize = nvals * bytePerPix;
    filesize = nvals * bytePerPix + 2880;
    filesize = ((filesize - 1) / 2880 + 1) * 2880; 

    /* open the raw binary disk file */
    status = file_openfile(rootfile, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open raw  binary file (mem_rawfile_open)");
        ffpmsg(rootfile);
        return(status);
    }

    /* create a memory file with corrct size for the FITS converted raw file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create memory file (mem_rawfile_open)");
        fclose(diskfile);
        return(status);
    }

    /* open this piece of memory as a new FITS file */
    ffimem(&fptr, (void **) memTable[*hdl].memaddrptr, &filesize, 0, 0, &status);

    /* write the required header keywords */
    ffcrim(fptr, datatype, naxis, dim, &status);

    /* close the FITS file, but keep the memory allocated */
    ffclos(fptr, &status);

    if (status > 0)
    {
        ffpmsg("failed to write basic image header (mem_rawfile_open)");
        fclose(diskfile);
        mem_close_free(*hdl);   /* free up the memory */
        return(status);
    }

    if (offset > 0)
       fseek(diskfile, offset, 0);   /* offset to start of the data */

    /* read the raw data into memory */
    ptr = *memTable[*hdl].memaddrptr + 2880;

    if (fread((char *) ptr, 1, datasize, diskfile) != datasize)
      status = READ_ERROR;

    fclose(diskfile);  /* close the raw binary disk file */

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to copy raw file data into memory (mem_rawfile_open)");
        return(status);
    }

    if (datatype == USHORT_IMG)  /* have to subtract 32768 from each unsigned */
    {                            /* value to conform to FITS convention. More */
                                 /* efficient way to do this is to just flip  */
                                 /* the most significant bit.                 */

      sptr = (short *) ptr;

      if (endian == BYTESWAPPED)  /* working with native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x8000;
        }
      }
      else  /* pixels are byteswapped WRT the native format */
      {
        for (ii = 0; ii < nvals; ii++, sptr++)
        {
          *sptr =  ( *sptr ) ^ 0x80;
        }
      }
    }

    if (endian)  /* swap the bytes if array is in little endian byte order */
    {
      if (datatype == SHORT_IMG || datatype == USHORT_IMG)
      {
        ffswap2( (short *) ptr, nvals);
      }
      else if (datatype == LONG_IMG || datatype == FLOAT_IMG)
      {
        ffswap4( (INT32BIT *) ptr, nvals);
      }

      else if (datatype == DOUBLE_IMG)
      {
        ffswap8( (double *) ptr, nvals);
      }
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;    /* and initial file size  */

    return(0);
}